

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::auxForward(Graph *this,Vertex *vertex,Edge *edge,int it)

{
  double dVar1;
  Edge *pEVar2;
  ostream *poVar3;
  Edge **ppEVar4;
  Edge *edge_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dStack_70;
  
  if (vertex == (Vertex *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  ppEVar4 = &vertex->edgesList;
  do {
    edge_00 = *ppEVar4;
    if (edge_00 == (Edge *)0x0) {
      return;
    }
    while( true ) {
      if (edge_00 == (Edge *)0x0) {
        return;
      }
      if (edge_00->closed != false) break;
      edge_00->activePowerFlow = 0.0;
      edge_00->reactivePowerFlow = 0.0;
      edge_00->activeLoss = 0.0;
      edge_00->reactiveLoss = 0.0;
      edge_00 = edge_00->nextEdge;
    }
    if (this->verticesList == vertex) {
      dVar8 = branchActiveLoss(this,edge_00->destiny);
      dVar5 = branchReactiveLoss(this,edge_00->destiny);
      edge_00->activePowerFlow = dVar8 + edge_00->activeLoss;
      edge_00->reactivePowerFlow = dVar5 + edge_00->reactiveLoss;
    }
    else {
      dVar8 = edge->activePowerFlow;
      if (it < 1) {
        auVar11 = ZEXT816(0);
      }
      else {
        dVar9 = edge->reactivePowerFlow * edge->reactivePowerFlow + dVar8 * dVar8;
        dVar5 = edge->origin->voltage;
        dVar5 = dVar5 * dVar5;
        auVar10._0_8_ = dVar9 * edge->resistance;
        auVar10._8_8_ = dVar9 * edge->reactance;
        auVar11._8_8_ = dVar5;
        auVar11._0_8_ = dVar5;
        auVar11 = divpd(auVar10,auVar11);
      }
      dVar5 = Vertex::getActivePower(vertex);
      edge_00->activePowerFlow = (dVar8 - auVar11._0_8_) - dVar5;
      dVar8 = edge->reactivePowerFlow;
      dStack_70 = auVar11._8_8_;
      dVar5 = Vertex::getReactivePower(vertex);
      edge_00->reactivePowerFlow = (dVar8 - dStack_70) - dVar5;
      if (1 < edge_00->origin->outdegree) {
        dVar8 = 0.0;
        dVar5 = 0.0;
        ppEVar4 = &vertex->edgesList;
        while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
          if ((pEVar2 != edge_00) && (pEVar2->closed == true)) {
            dVar9 = pEVar2->activeLoss;
            dVar6 = branchActiveLoss(this,pEVar2->destiny);
            dVar1 = pEVar2->reactiveLoss;
            dVar7 = branchReactiveLoss(this,pEVar2->destiny);
            dVar8 = dVar8 + dVar6 + dVar9;
            dVar5 = dVar5 + dVar7 + dVar1;
          }
          ppEVar4 = &pEVar2->nextEdge;
        }
        edge_00->activePowerFlow = edge_00->activePowerFlow - dVar8;
        edge_00->reactivePowerFlow = edge_00->reactivePowerFlow - dVar5;
      }
    }
    auxForward(this,edge_00->destiny,edge_00,it);
    ppEVar4 = &edge_00->nextEdge;
  } while( true );
}

Assistant:

void Graph::auxForward(Vertex *vertex, Edge *edge, int it){
    if(vertex == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){

            double active_power     = 0.0;
            double reactive_power   = 0.0;

            /// set open edges with flow-free
            while(e!=NULL && !e->isClosed() ){

                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                e = e->getNext();
            }
            if(e==NULL)
                break;

            //chute inicial para o fluxo nas arests que partem do no terminal
            if( vertex==this->verticesList ) {
                double activeLossCharge = branchActiveLoss(e->getDestiny());
                double reactiveLossCharge = branchReactiveLoss(e->getDestiny());

                e->setActiveFlow(activeLossCharge + e->getActiveLoss());
                e->setReactiveFlow(reactiveLossCharge + e->getReactiveLoss());

            } else {
                //a partir da primeira iteracao considera-se a perda calculada na iteracao anterior
                if(it>0){
                    active_power = edge->getResistance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                            edge->getOrigin()->getVoltage(), 2);    // Q = R*P^2 + Q^2/V^2
                    reactive_power =
                            edge->getReactance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                                    edge->getOrigin()->getVoltage(), 2);
                }

                e->setActiveFlow(edge->getActivePowerFlow() - active_power - vertex->getActivePower());
                e->setReactiveFlow(edge->getReactivePowerFlow() - reactive_power - vertex->getReactivePower());

                //bifurcacao - o fluxo que seque para o arco 'a' deve-se subtrair a soma de cargas e perdas dos ramos de bifurcacoes
                if(e->getOrigin()->getIndegree()>1){
                    double somaAtiv=0.0, somaReAtiv=0.0;
                    for(Edge *aux= vertex->getEdgesList(); aux!=NULL; aux= aux->getNext()){
                        if(aux!=e && aux->isClosed()==true){
                            somaAtiv+= aux->getActiveLoss() + branchActiveLoss(aux->getDestiny());
                            somaReAtiv+= aux->getReactiveLoss() + branchReactiveLoss(aux->getDestiny());
                        }
                    }

                    e->setActiveFlow(e->getActivePowerFlow() - somaAtiv);
                    e->setReactiveFlow(e->getReactivePowerFlow() - somaReAtiv);
                }
            }

            auxForward(e->getDestiny(), e, it);
        }
    }
}